

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  void *pvVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  uint *puVar27;
  long lVar28;
  undefined4 uVar29;
  long lVar30;
  void *pvVar31;
  undefined2 *puVar32;
  void *pvVar33;
  undefined2 *puVar34;
  void *pvVar35;
  void *pvVar36;
  long lVar37;
  undefined2 *puVar38;
  undefined2 *puVar39;
  int k;
  void *pvVar40;
  short tmp [6] [3];
  long local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  Mat local_118;
  ulong local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  ulong local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar23 = (ulong)(uint)outch;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  Mat::create(&local_118,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar22 = kernel->data;
    local_170 = local_118.data;
    local_180 = (void *)0x0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_180;
        uVar20 = 0;
        pvVar25 = local_170;
        do {
          lVar24 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar22 + lVar24 + iVar18);
          cVar2 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar22 + lVar24 + (long)iVar18 + 8);
          lVar24 = 4;
          do {
            sVar10 = *(short *)(&UNK_00553aec + lVar24);
            sVar11 = *(short *)(&UNK_00553aee + lVar24);
            sVar12 = *(short *)((long)&DAT_00553af0 + lVar24);
            *(short *)((long)&local_60 + lVar24 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar24 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar24 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar24 = lVar24 + 6;
          } while (lVar24 != 0x28);
          lVar24 = 0;
          pvVar19 = pvVar25;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar24 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar24 * 6);
            puVar27 = &DAT_00553af2;
            lVar28 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar27),ZEXT416(uVar13));
              uVar29 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar28 * 2) =
                   (short)uVar29 + auVar16._0_2_ + *(short *)((long)puVar27 + -2) * sVar10;
              lVar28 = lVar28 + 1;
              puVar27 = (uint *)((long)puVar27 + 6);
            } while (lVar28 != 6);
            lVar24 = lVar24 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar24 != 6);
          uVar20 = uVar20 + 1;
          pvVar25 = (void *)((long)pvVar25 + (long)local_118.w * local_118.elemsize);
        } while (uVar20 != (uint)inch);
      }
      local_180 = (void *)((long)local_180 + 1);
      local_170 = (void *)((long)local_170 + local_118.cstep * local_118.elemsize);
    } while (local_180 != (void *)uVar23);
  }
  iVar18 = outch + 3;
  if (-1 < outch) {
    iVar18 = outch;
  }
  local_c8 = uVar23;
  Mat::create(kernel_tm,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
  uVar20 = 0;
  if (3 < outch) {
    lVar28 = (long)local_118.w;
    lVar30 = local_118.elemsize * local_118.cstep;
    local_b0 = kernel_tm->data;
    local_b8 = kernel_tm->cstep * kernel_tm->elemsize;
    local_60 = (long)kernel_tm->w * kernel_tm->elemsize;
    lVar26 = local_118.elemsize * lVar28;
    local_c0 = lVar30 * 4;
    lVar24 = lVar26 * 8;
    pvVar22 = (void *)((local_118.cstep * 3 + lVar28) * local_118.elemsize + (long)local_118.data);
    uVar20 = 0;
    pvVar25 = (void *)((lVar28 + local_118.cstep * 2) * local_118.elemsize + (long)local_118.data);
    pvVar19 = (void *)((long)local_118.data + lVar30 * 2);
    pvVar31 = local_118.data;
    pvVar33 = (void *)((local_118.cstep + lVar28) * local_118.elemsize + (long)local_118.data);
    pvVar35 = (void *)(lVar30 + (long)local_118.data);
    pvVar36 = (void *)((long)local_118.data + lVar26);
    pvVar40 = (void *)(lVar30 * 3 + (long)local_118.data);
    do {
      local_98 = pvVar40;
      local_90 = pvVar36;
      local_78 = pvVar35;
      local_70 = pvVar33;
      local_68 = pvVar31;
      local_a0 = pvVar19;
      local_88 = pvVar25;
      local_a8 = uVar20;
      local_80 = pvVar22;
      local_188 = 0;
      local_180 = local_90;
      local_178 = local_68;
      local_170 = local_70;
      local_160 = local_80;
      local_158 = local_88;
      local_150 = local_98;
      local_148 = local_a0;
      local_140 = local_78;
      do {
        if (7 < inch) {
          lVar30 = (long)local_b0 + local_60 * local_188 + (local_a8 >> 2) * local_b8;
          pvVar22 = local_140;
          lVar28 = 0;
          pvVar25 = local_178;
          pvVar19 = local_150;
          pvVar31 = local_148;
          pvVar33 = local_158;
          pvVar35 = local_170;
          pvVar36 = local_160;
          pvVar40 = local_180;
          do {
            lVar21 = 0;
            lVar37 = 0;
            do {
              *(undefined2 *)(lVar30 + lVar37) = *(undefined2 *)((long)pvVar25 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 2) = *(undefined2 *)((long)pvVar40 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 4) = *(undefined2 *)((long)pvVar22 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 6) = *(undefined2 *)((long)pvVar35 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 8) = *(undefined2 *)((long)pvVar31 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 10) = *(undefined2 *)((long)pvVar33 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 0xc) = *(undefined2 *)((long)pvVar19 + lVar21);
              *(undefined2 *)(lVar30 + lVar37 + 0xe) = *(undefined2 *)((long)pvVar36 + lVar21);
              lVar37 = lVar37 + 0x10;
              lVar21 = lVar21 + lVar26 * 2;
            } while (lVar37 != 0x40);
            lVar21 = lVar28 + 0xf;
            pvVar36 = (void *)((long)pvVar36 + lVar24);
            pvVar33 = (void *)((long)pvVar33 + lVar24);
            pvVar35 = (void *)((long)pvVar35 + lVar24);
            pvVar40 = (void *)((long)pvVar40 + lVar24);
            pvVar19 = (void *)((long)pvVar19 + lVar24);
            pvVar31 = (void *)((long)pvVar31 + lVar24);
            pvVar22 = (void *)((long)pvVar22 + lVar24);
            pvVar25 = (void *)((long)pvVar25 + lVar24);
            lVar30 = lVar30 + 0x40;
            lVar28 = lVar28 + 8;
          } while (lVar21 < inch);
        }
        local_188 = local_188 + 1;
        local_160 = (void *)((long)local_160 + 2);
        local_158 = (void *)((long)local_158 + 2);
        local_170 = (void *)((long)local_170 + 2);
        local_180 = (void *)((long)local_180 + 2);
        local_150 = (void *)((long)local_150 + 2);
        local_148 = (void *)((long)local_148 + 2);
        local_140 = (void *)((long)local_140 + 2);
        local_178 = (void *)((long)local_178 + 2);
      } while (local_188 != 0x24);
      uVar20 = local_a8 + 4;
      pvVar22 = (void *)((long)local_80 + local_c0);
      pvVar25 = (void *)((long)local_88 + local_c0);
      pvVar19 = (void *)((long)local_a0 + local_c0);
      pvVar31 = (void *)((long)local_68 + local_c0);
      pvVar33 = (void *)((long)local_70 + local_c0);
      pvVar35 = (void *)((long)local_78 + local_c0);
      pvVar36 = (void *)((long)local_90 + local_c0);
      pvVar40 = (void *)((long)local_98 + local_c0);
    } while (local_a8 + 7 < uVar23);
    outch = (int)local_c8;
  }
  if ((int)uVar20 < outch) {
    iVar18 = kernel_tm->w;
    pvVar22 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar20 = uVar20 & 0xffffffff;
    puVar32 = (undefined2 *)(local_118.cstep * local_118.elemsize * uVar20 + (long)local_118.data);
    do {
      lVar24 = 0;
      puVar34 = puVar32;
      do {
        if (7 < inch) {
          lVar26 = (long)pvVar22 +
                   (long)iVar18 * sVar14 * lVar24 +
                   (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                   sVar15 * sVar14;
          lVar28 = 0;
          puVar39 = puVar34;
          do {
            lVar30 = 0;
            puVar38 = puVar39;
            do {
              *(undefined2 *)(lVar26 + lVar30) = *puVar38;
              puVar38 = (undefined2 *)((long)puVar38 + (long)local_118.w * local_118.elemsize);
              lVar30 = lVar30 + 2;
            } while (lVar30 != 0x10);
            lVar30 = lVar28 + 0xf;
            puVar39 = puVar39 + (long)local_118.w * local_118.elemsize * 4;
            lVar26 = lVar26 + 0x10;
            lVar28 = lVar28 + 8;
          } while (lVar30 < inch);
        }
        lVar24 = lVar24 + 1;
        puVar34 = puVar34 + 1;
      } while (lVar24 != 0x24);
      uVar20 = uVar20 + 1;
      puVar32 = (undefined2 *)((long)puVar32 + local_118.cstep * local_118.elemsize);
    } while (uVar20 != uVar23);
  }
  piVar17 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}